

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_parsednumber.cpp
# Opt level: O3

void __thiscall icu_63::numparse::impl::ParsedNumber::ParsedNumber(ParsedNumber *this)

{
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&this->quantity);
  (this->prefix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (this->prefix).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->suffix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (this->suffix).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->quantity).bogus = true;
  this->charEnd = 0;
  this->flags = 0;
  UnicodeString::setToBogus(&this->prefix);
  UnicodeString::setToBogus(&this->suffix);
  this->currencyCode[0] = L'\0';
  return;
}

Assistant:

ParsedNumber::ParsedNumber() {
    clear();
}